

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.h
# Opt level: O0

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator[](XmlRpcValue *this,int i)

{
  reference pvVar1;
  undefined4 in_ESI;
  size_type in_RDI;
  int in_stack_0000005c;
  XmlRpcValue *in_stack_00000060;
  undefined4 in_stack_fffffffffffffff0;
  
  assertArray(in_stack_00000060,in_stack_0000005c);
  pvVar1 = std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::at
                     ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                      CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  return pvVar1;
}

Assistant:

XmlRpcValue& operator[](int i)             { assertArray(i+1); return _value.asArray->at(i); }